

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  int iVar1;
  Extension *pEVar2;
  undefined4 extraout_var;
  MessageLite *pMVar3;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    pMVar3 = (MessageLite *)0x0;
  }
  else {
    if ((pEVar2->field_0xa & 0x10) == 0) {
      pMVar3 = (pEVar2->field_0).message_value;
      if (this->arena_ != (Arena *)0x0) {
        iVar1 = (*pMVar3->_vptr_MessageLite[3])(pMVar3);
        pMVar3 = (MessageLite *)CONCAT44(extraout_var,iVar1);
        (*pMVar3->_vptr_MessageLite[10])(pMVar3,(pEVar2->field_0).int64_value);
      }
    }
    else {
      pMVar3 = (MessageLite *)
               (*(code *)(((((pEVar2->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                          arena_)->impl_).options_.initial_block)
                         ((pEVar2->field_0).repeated_string_value,prototype);
      if ((this->arena_ == (Arena *)0x0) &&
         ((pEVar2->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0)) {
        (*(code *)(((((pEVar2->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)
                  ->impl_).hint_._M_b._M_p)();
      }
    }
    Erase(this,number);
  }
  return pMVar3;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == NULL) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = NULL;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->ReleaseMessage(prototype);
      if (arena_ == NULL) {
        delete extension->lazymessage_value;
      }
    } else {
      if (arena_ == NULL) {
        ret = extension->message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->message_value);
      }
    }
    Erase(number);
    return ret;
  }
}